

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.cpp
# Opt level: O1

void __thiscall cornelich::region::region(region *this,string *path,uint32_t size,int32_t index)

{
  pointer pcVar1;
  size_t sVar2;
  file_mapping local_50;
  
  (this->m_path)._M_dataplus._M_p = (pointer)&(this->m_path).field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + path->_M_string_length);
  this->m_index = index;
  this->m_size = (ulong)size;
  util::create_mapping(&local_50,path,size);
  boost::interprocess::mapped_region::mapped_region<boost::interprocess::file_mapping>
            (&this->m_region,&local_50,read_write,0,(ulong)size,(void *)0x0,-1);
  if (local_50.m_handle != -1) {
    close(local_50.m_handle);
    local_50.m_handle = -1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_filename._M_dataplus._M_p != &local_50.m_filename.field_2) {
    operator_delete(local_50.m_filename._M_dataplus._M_p);
  }
  this->m_start_offset = 0;
  this->m_limit_offset = size;
  (this->m_position_offset).super___atomic_base<int>._M_i = 0;
  sVar2 = (this->m_region).m_page_offset;
  posix_madvise((void *)((long)(this->m_region).m_base - sVar2),sVar2 + (this->m_region).m_size,3);
  return;
}

Assistant:

region::region(const std::string & path, std::uint32_t size, std::int32_t index)
    : m_path(path)
    , m_index(index)
    , m_size(size)
    , m_region(util::create_mapping(path, size), bip::read_write, 0, static_cast<std::size_t>(size), 0)
    , m_start_offset(0)
    , m_limit_offset(size)
    //, m_capacity_offset(size)
    , m_position_offset(0)
{
    m_region.advise(bip::mapped_region::advice_willneed);
}